

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-test.c
# Opt level: O0

char * append(char *original,char *append)

{
  size_t sVar1;
  char *__dest;
  undefined8 local_38;
  char *dest;
  size_t alen;
  size_t olen;
  char *append_local;
  char *original_local;
  
  if (original == (char *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = strlen(original);
  }
  sVar1 = strlen(append);
  __dest = (char *)malloc(local_38 + sVar1 + 1);
  *__dest = '\0';
  if (original != (char *)0x0) {
    strcpy(__dest,original);
    free(original);
  }
  strcat(__dest,append);
  return __dest;
}

Assistant:

static char *append(char *original, const char *append) {
	size_t olen, alen;
	char *dest;
	
	olen = original != NULL ? strlen(original) : 0;
	alen = strlen(append);

	dest = (char *)malloc(olen + alen + 1);
	dest[0] = '\0';

	if (original != NULL) {
		strcpy(dest, original);

		free(original);
	}

	strcat(dest, append);
	return dest;
}